

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O0

vm_filnam_ext * vm_filnam_ext::alloc_ext(CVmObjFileName *self,int32_t sfid,char *str,size_t len)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  size_t in_RCX;
  void *in_RDX;
  int32_t in_ESI;
  undefined8 in_RDI;
  vm_filnam_ext *ext;
  size_t siz;
  size_t in_stack_ffffffffffffffc8;
  vm_filnam_ext *buf;
  
  pCVar2 = CVmMemory::get_var_heap(G_mem_X);
  iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,in_RCX + 10,in_RDI);
  buf = (vm_filnam_ext *)CONCAT44(extraout_var,iVar1);
  buf->sfid = in_ESI;
  buf->sfid_valid = '\x01';
  buf->from_ui = '\0';
  vmb_put_len((char *)buf,in_stack_ffffffffffffffc8);
  buf[1].str[in_RCX - 6] = '\0';
  if (in_RDX != (void *)0x0) {
    memcpy(buf + 1,in_RDX,in_RCX);
  }
  return buf;
}

Assistant:

vm_filnam_ext *vm_filnam_ext::alloc_ext(
    VMG_ CVmObjFileName *self, int32_t sfid, const char *str, size_t len)
{
    /* 
     *   Calculate how much space we need - we need space for the name string
     *   plus its length prefix; store the name string with a null terminator
     *   for convenience in calling osifc routines.
     */
    size_t siz = (sizeof(vm_filnam_ext)-1) + (VMB_LEN + len + 1);

    /* allocate the memory */
    vm_filnam_ext *ext = (vm_filnam_ext *)G_mem->get_var_heap()->alloc_mem(
        siz, self);

    /* store the special file ID; assume it's valid */
    ext->sfid = sfid;
    ext->sfid_valid = TRUE;

    /* assume that the file didn't come from a manual user interaction */
    ext->from_ui = 0;

    /* set the string length and null terminator */
    vmb_put_len(ext->str, len);
    ext->str[VMB_LEN + len] = '\0';

    /* copy the string, if provided */
    if (str != 0)
        memcpy(ext->str + VMB_LEN, str, len);

    /* return the new extension */
    return ext;
}